

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

int hasB64Wrapper(string_view str)

{
  int iVar1;
  string_view str_local;
  
  str_local._M_str = str._M_str;
  str_local._M_len = str._M_len;
  if (*str_local._M_str == '\"') {
    if (str_local._M_len < 8) {
      return 0;
    }
    iVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&str_local,2,3,"64[");
    if ((iVar1 == 0) && (str_local._M_str[str_local._M_len - 2] == ']')) {
      return 5;
    }
    if (str_local._M_len < 0xb) {
      return 0;
    }
    iVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&str_local,5,3,"64[");
    if ((iVar1 == 0) && (str_local._M_str[str_local._M_len - 2] == ']')) {
      return 8;
    }
  }
  else {
    if (str_local._M_len < 6) {
      return 0;
    }
    iVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&str_local,1,3,"64[");
    if ((iVar1 == 0) && (str_local._M_str[str_local._M_len - 1] == ']')) {
      return 4;
    }
    if (str_local._M_len < 9) {
      return 0;
    }
    iVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&str_local,4,3,"64[");
    if ((iVar1 == 0) && (str_local._M_str[str_local._M_len - 1] == ']')) {
      return 7;
    }
  }
  return 0;
}

Assistant:

static int hasB64Wrapper(std::string_view str)
{
    if (str.front() == '\"') {
        if (str.size() < 8) {
            return 0;
        }
        if ((str.compare(2, 3, "64[") == 0) && (str[str.size() - 2] == ']')) {
            return 5;
        }
        if (str.size() < 11) {
            return 0;
        }
        if ((str.compare(5, 3, "64[") == 0) && (str[str.size() - 2] == ']')) {
            return 8;
        }
    } else {
        if (str.size() < 6) {
            return 0;
        }
        if ((str.compare(1, 3, "64[") == 0) && (str.back() == ']')) {
            return 4;
        }
        if (str.size() < 9) {
            return 0;
        }
        if ((str.compare(4, 3, "64[") == 0) && (str.back() == ']')) {
            return 7;
        }
    }

    return 0;
}